

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O1

char * cinatra::detail::parse_response
                 (char *buf,char *buf_end,int *minor_version,int *status,char **msg,size_t *msg_len,
                 http_header *headers,size_t *num_headers,size_t max_headers,int *ret)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  bool has_upgrade;
  bool has_close;
  bool has_connection;
  
  pcVar2 = parse_http_version(buf,buf_end,minor_version,ret);
  if (pcVar2 == (char *)0x0) {
    return (char *)0x0;
  }
  if (*pcVar2 != ' ') goto LAB_001d9f50;
  if ((long)buf_end - (long)(pcVar2 + 1) < 4) {
    *ret = -2;
    return (char *)0x0;
  }
  if ((byte)(pcVar2[1] - 0x3aU) < 0xf6) {
    pcVar3 = pcVar2 + 2;
LAB_001d9ee7:
    *ret = -1;
    bVar1 = false;
  }
  else {
    iVar4 = (uint)(byte)(pcVar2[1] - 0x30) * 100;
    *status = iVar4;
    if ((byte)(pcVar2[2] - 0x3aU) < 0xf6) {
      pcVar3 = pcVar2 + 3;
      goto LAB_001d9ee7;
    }
    iVar4 = iVar4 + (uint)(byte)(pcVar2[2] * '\n' + 0x20);
    *status = iVar4;
    pcVar3 = pcVar2 + 4;
    if ((byte)(pcVar2[3] - 0x3aU) < 0xf6) goto LAB_001d9ee7;
    *status = iVar4 + (uint)(byte)(pcVar2[3] - 0x30);
    bVar1 = true;
  }
  if (!bVar1) {
    return (char *)0x0;
  }
  if (*pcVar3 == ' ') {
    pcVar2 = get_token_to_eol(pcVar3 + 1,buf_end,msg,msg_len,ret);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    pcVar2 = parse_headers(pcVar2,buf_end,headers,num_headers,max_headers,ret,&has_connection,
                           &has_close,&has_upgrade);
    return pcVar2;
  }
LAB_001d9f50:
  *ret = -1;
  return (char *)0x0;
}

Assistant:

inline const char *parse_response(const char *buf, const char *buf_end,
                                  int *minor_version, int *status,
                                  const char **msg, size_t *msg_len,
                                  http_header *headers, size_t *num_headers,
                                  size_t max_headers, int *ret) {
  /* parse "HTTP/1.x" */
  if ((buf = parse_http_version(buf, buf_end, minor_version, ret)) == NULL) {
    return NULL;
  }
  /* skip space */
  if (*buf++ != ' ') {
    *ret = -1;
    return NULL;
  }
  /* parse status code, we want at least [:digit:][:digit:][:digit:]<other char>
   * to try to parse */
  if (buf_end - buf < 4) {
    *ret = -2;
    return NULL;
  }
  PARSE_INT_3(status);

  /* skip space */
  if (*buf++ != ' ') {
    *ret = -1;
    return NULL;
  }
  /* get message */
  if ((buf = get_token_to_eol(buf, buf_end, msg, msg_len, ret)) == NULL) {
    return NULL;
  }

  bool has_connection, has_close, has_upgrade;

  return parse_headers(buf, buf_end, headers, num_headers, max_headers, ret,
                       has_connection, has_close, has_upgrade);
}